

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O2

void __thiscall CppLogger::CppLogger::setFormat(CppLogger *this,Format *t_Format)

{
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  _Var1;
  long lVar2;
  _Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_68;
  _Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_50;
  _Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_38;
  
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             &local_50,&t_Format->m_Format);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             &local_68,&t_Format->m_Format);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<CppLogger::FormatAttribute*,std::vector<CppLogger::FormatAttribute,std::allocator<CppLogger::FormatAttribute>>>,__gnu_cxx::__ops::_Iter_equals_val<CppLogger::FormatAttribute_const>>
                    (local_50._M_impl.super__Vector_impl_data._M_start,
                     local_68._M_impl.super__Vector_impl_data._M_finish);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             &local_38,&t_Format->m_Format);
  std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
  ~_Vector_base(&local_38);
  std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
  ~_Vector_base(&local_68);
  std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
  ~_Vector_base(&local_50);
  if (_Var1._M_current == local_38._M_impl.super__Vector_impl_data._M_finish) {
    Format::addMessage(t_Format);
  }
  for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 0x18) {
    std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::operator=
              ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
               (&this->field_0x28 + lVar2),&t_Format->m_Format);
  }
  return;
}

Assistant:

void CppLogger::setFormat(Format& t_Format) {
        if (std::find(t_Format.getFormat().begin(), t_Format.getFormat().end(), FormatAttribute::Message) == t_Format.getFormat().end()) {
            t_Format.addMessage();
        }
        for (auto &format : m_Format) {
            format = t_Format;
        }
    }